

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

int __thiscall ON_wString::FindOneOf(ON_wString *this,wchar_t *character_set)

{
  wchar_t *pwVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ON_Internal_Empty_wString *pOVar7;
  int iVar8;
  wchar_t *pwVar9;
  wchar_t *pwVar10;
  int local_7c;
  ON_UnicodeErrorParameters e;
  ON__UINT32 sUTF32 [2];
  wchar_t buffer [10];
  
  iVar6 = -1;
  if ((character_set != (wchar_t *)0x0) && (*character_set != L'\0')) {
    pOVar7 = &empty_wstring;
    if (this->m_s != (wchar_t *)0x0) {
      pOVar7 = (ON_Internal_Empty_wString *)(this->m_s + -3);
    }
    if (0 < (pOVar7->header).string_length) {
      pwVar9 = character_set + -1;
      pwVar10 = pwVar9;
      do {
        pwVar10 = pwVar10 + 1;
        pwVar1 = pwVar9 + 1;
        pwVar9 = pwVar9 + 1;
      } while (*pwVar1 != L'\0');
      e.m_error_code_point = 0;
      e.m_error_status = 0;
      e.m_error_mask = 0xe;
      buffer[8] = L'\0';
      buffer[9] = L'\0';
      buffer[4] = L'\0';
      buffer[5] = L'\0';
      buffer[6] = L'\0';
      buffer[7] = L'\0';
      buffer[0] = L'\0';
      buffer[1] = L'\0';
      buffer[2] = L'\0';
      buffer[3] = L'\0';
      sUTF32[0] = 0;
      sUTF32[1] = 0;
      do {
        if (pwVar9 <= character_set) {
          return -1;
        }
        e._0_8_ = e._0_8_ & 0xffffffff00000000;
        uVar4 = ON_DecodeWideChar(character_set,
                                  (int)((ulong)((long)pwVar10 - (long)character_set) >> 2),&e,sUTF32
                                 );
        uVar2 = e._0_8_;
        iVar8 = 5;
        iVar6 = local_7c;
        if (((0 < (int)uVar4) && (sUTF32[0] != 0)) && (sUTF32[1] == 0)) {
          e._0_8_ = e._0_8_ & 0xffffffff00000000;
          uVar3 = e._0_8_;
          e.m_error_mask = SUB84(uVar2,4);
          uVar5 = e.m_error_mask;
          e._0_8_ = uVar3;
          uVar5 = ON_ConvertUTF32ToWideChar
                            (0,sUTF32,1,buffer,9,&e.m_error_status,uVar5,e.m_error_code_point,
                             (ON__UINT32 **)0x0);
          if (uVar5 - 1 < 8 && e.m_error_status == 0) {
            buffer[uVar5] = L'\0';
            iVar6 = Find(this,buffer,0);
            iVar8 = 1;
            if (-1 < iVar6) goto LAB_006818d2;
          }
          character_set = character_set + uVar4;
          iVar8 = 0;
          iVar6 = local_7c;
        }
LAB_006818d2:
        local_7c = iVar6;
      } while (iVar8 == 0);
      iVar6 = -1;
      if (iVar8 != 5) {
        iVar6 = local_7c;
      }
    }
  }
  return iVar6;
}

Assistant:

int ON_wString::FindOneOf (const wchar_t* character_set) const
{
  if ( nullptr == character_set || 0 == character_set[0] || IsEmpty() )
    return -1;

  const wchar_t* s1 = character_set;
  while ( 0 != *s1 )
    s1++;

  ON_UnicodeErrorParameters e = { 0 };
  e.m_error_mask = 2 | 4 | 8;

  const wchar_t* s = character_set;
  wchar_t buffer[10] = { 0 };
  const int buffer_capacity = sizeof(buffer) / sizeof(buffer[0]) - 1;
  ON__UINT32 sUTF32[2] = { 0 };
  while (s < s1)
  {
    e.m_error_status = 0;
    int s_count = ON_DecodeWideChar(s, (int)(s1 - s), &e, &sUTF32[0]);
    if (s_count <= 0 || 0 == sUTF32[0] || 0 != sUTF32[1])
      break;
    e.m_error_status = 0;
    int buffer_count = ON_ConvertUTF32ToWideChar(
      false,
      sUTF32, 1,
      buffer, buffer_capacity,
      &e.m_error_status,
      e.m_error_mask,
      e.m_error_code_point,
      nullptr);
    if (0 == e.m_error_status && buffer_count > 0 && buffer_count < buffer_capacity)
    {
      buffer[buffer_count] = 0;
      int rc = Find(buffer);
      if (rc >= 0)
        return rc;
    }
    s += s_count;
  }
  return -1;
}